

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheNewBoolean(xmlXPathParserContextPtr pctxt,int val)

{
  xmlXPathContextPtr pxVar1;
  void *pvVar2;
  xmlXPathContextCachePtr cache;
  xmlXPathContextPtr ctxt;
  xmlXPathObjectPtr ret;
  int val_local;
  xmlXPathParserContextPtr pctxt_local;
  
  pxVar1 = pctxt->context;
  if (((pxVar1 == (xmlXPathContextPtr)0x0) || (pxVar1->cache == (void *)0x0)) ||
     (pvVar2 = pxVar1->cache, *(long *)((long)pvVar2 + 8) == 0)) {
    pctxt_local = (xmlXPathParserContextPtr)xmlXPathNewBoolean(val);
    if (pctxt_local == (xmlXPathParserContextPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
    }
  }
  else {
    pctxt_local = *(xmlXPathParserContextPtr *)((long)pvVar2 + 8);
    *(xmlXPathObjectPtr *)((long)pvVar2 + 8) = pctxt_local->value;
    *(int *)((long)pvVar2 + 0x18) = *(int *)((long)pvVar2 + 0x18) + -1;
    pctxt_local->value = (xmlXPathObjectPtr)0x0;
    *(undefined4 *)&pctxt_local->cur = 2;
    pctxt_local->error = (uint)(val != 0);
  }
  return (xmlXPathObjectPtr)pctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewBoolean(xmlXPathParserContextPtr pctxt, int val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_BOOLEAN;
	    ret->boolval = (val != 0);
	    return(ret);
	}
    }

    ret = xmlXPathNewBoolean(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}